

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cpp
# Opt level: O0

FastString __thiscall Strings::quotedPrintable(Strings *this,FastString *textToQuote)

{
  int iVar1;
  char *pcVar2;
  uchar *extraout_RDX;
  FastString FVar3;
  int local_4c;
  int i;
  char *text;
  undefined1 local_30 [8];
  QuotedEncoding enc;
  FastString *textToQuote_local;
  FastString *out;
  
  enc.lastOne._3_1_ = 0;
  Bstrlib::String::String((String *)this);
  QuotedEncoding::QuotedEncoding((QuotedEncoding *)local_30,(FastString *)this);
  pcVar2 = Bstrlib::String::operator_cast_to_char_(textToQuote);
  for (local_4c = 0; iVar1 = Bstrlib::String::getLength(textToQuote), local_4c < iVar1;
      local_4c = local_4c + 1) {
    QuotedEncoding::quoteChar((QuotedEncoding *)local_30,pcVar2[local_4c]);
  }
  FVar3.super_tagbstring.data = extraout_RDX;
  FVar3.super_tagbstring._0_8_ = this;
  return (FastString)FVar3.super_tagbstring;
}

Assistant:

FastString quotedPrintable(const FastString & textToQuote)
    {
        FastString out; QuotedEncoding enc(out);
        const char * text = (const char *)textToQuote;
        for (int i = 0; i < textToQuote.getLength(); i++)
            enc.quoteChar(text[i]);
        return out;
    }